

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O2

bool __thiscall google::protobuf::compiler::ZipWriter::WriteDirectory(ZipWriter *this)

{
  uint16_t uVar1;
  uint32_t value;
  uint32_t value_00;
  pointer pFVar2;
  bool bVar3;
  uint32_t value_01;
  uint32_t uVar4;
  long lVar5;
  ulong uVar6;
  undefined8 in_RSI;
  CodedOutputStream output;
  
  lVar5 = (long)(this->files_).
                super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->files_).
                super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = lVar5 / 0x30;
  value_01 = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])
                       (this->raw_output_,in_RSI,lVar5 % 0x30);
  io::CodedOutputStream::CodedOutputStream(&output,this->raw_output_);
  for (lVar5 = 0; (uVar6 & 0xffff) * 0x30 != lVar5; lVar5 = lVar5 + 0x30) {
    pFVar2 = (this->files_).
             super__Vector_base<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(uint16_t *)((long)&(pFVar2->name)._M_string_length + lVar5);
    uVar4 = *(uint32_t *)((long)&pFVar2->crc32 + lVar5);
    value = *(uint32_t *)((long)&pFVar2->size + lVar5);
    value_00 = *(uint32_t *)((long)&pFVar2->offset + lVar5);
    io::CodedOutputStream::WriteLittleEndian32(&output,0x2014b50);
    WriteShort(&output,10);
    WriteShort(&output,10);
    WriteShort(&output,0);
    WriteShort(&output,0);
    WriteShort(&output,0);
    WriteShort(&output,0x21);
    io::CodedOutputStream::WriteLittleEndian32(&output,uVar4);
    io::CodedOutputStream::WriteLittleEndian32(&output,value);
    io::CodedOutputStream::WriteLittleEndian32(&output,value);
    WriteShort(&output,uVar1);
    WriteShort(&output,0);
    WriteShort(&output,0);
    WriteShort(&output,0);
    WriteShort(&output,0);
    io::CodedOutputStream::WriteLittleEndian32(&output,0);
    io::CodedOutputStream::WriteLittleEndian32(&output,value_00);
    io::CodedOutputStream::WriteString
              (&output,(string *)((long)&(pFVar2->name)._M_dataplus._M_p + lVar5));
  }
  uVar4 = io::CodedOutputStream::ByteCount(&output);
  io::CodedOutputStream::WriteLittleEndian32(&output,0x6054b50);
  WriteShort(&output,0);
  WriteShort(&output,0);
  uVar1 = (uint16_t)uVar6;
  WriteShort(&output,uVar1);
  WriteShort(&output,uVar1);
  io::CodedOutputStream::WriteLittleEndian32(&output,uVar4);
  io::CodedOutputStream::WriteLittleEndian32(&output,value_01);
  WriteShort(&output,0);
  bVar3 = io::CodedOutputStream::HadError(&output);
  io::CodedOutputStream::~CodedOutputStream(&output);
  return bVar3;
}

Assistant:

bool ZipWriter::WriteDirectory() {
  uint16_t num_entries = files_.size();
  uint32_t dir_ofs = raw_output_->ByteCount();

  // write central directory
  io::CodedOutputStream output(raw_output_);
  for (int i = 0; i < num_entries; ++i) {
    const std::string& filename = files_[i].name;
    uint16_t filename_size = filename.size();
    uint32_t crc32 = files_[i].crc32;
    uint32_t size = files_[i].size;
    uint32_t offset = files_[i].offset;

    output.WriteLittleEndian32(0x02014b50);  // magic
    WriteShort(&output, 10);                 // version made by
    WriteShort(&output, 10);                 // version needed to extract
    WriteShort(&output, 0);                  // flags
    WriteShort(&output, 0);                  // compression method: stored
    WriteShort(&output, 0);                  // last modified time
    WriteShort(&output, kDosEpoch);          // last modified date
    output.WriteLittleEndian32(crc32);       // crc-32
    output.WriteLittleEndian32(size);        // compressed size
    output.WriteLittleEndian32(size);        // uncompressed size
    WriteShort(&output, filename_size);      // file name length
    WriteShort(&output, 0);                  // extra field length
    WriteShort(&output, 0);                  // file comment length
    WriteShort(&output, 0);                  // starting disk number
    WriteShort(&output, 0);                  // internal file attributes
    output.WriteLittleEndian32(0);           // external file attributes
    output.WriteLittleEndian32(offset);      // local header offset
    output.WriteString(filename);            // file name
  }
  uint32_t dir_len = output.ByteCount();

  // write end of central directory marker
  output.WriteLittleEndian32(0x06054b50);  // magic
  WriteShort(&output, 0);                  // disk number
  WriteShort(&output, 0);               // disk with start of central directory
  WriteShort(&output, num_entries);     // central directory entries (this disk)
  WriteShort(&output, num_entries);     // central directory entries (total)
  output.WriteLittleEndian32(dir_len);  // central directory byte size
  output.WriteLittleEndian32(dir_ofs);  // central directory offset
  WriteShort(&output, 0);               // comment length

  return output.HadError();
}